

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::basisu_transcoder::write_opaque_alpha_blocks
               (uint32_t num_blocks_x,uint32_t num_blocks_y,void *pOutput_blocks,block_format fmt,
               uint32_t block_stride_in_bytes,uint32_t output_row_pitch_in_blocks_or_pixels)

{
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  uint in_R9D;
  uint32_t x_1;
  uint32_t dst_ofs_1;
  uint32_t y_1;
  dxt5a_block blk_1;
  uint32_t x;
  uint32_t dst_ofs;
  uint32_t y;
  eac_block blk;
  uint local_44;
  uint local_40;
  uint local_3c;
  undefined6 uStack_36;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_1c;
  int local_18;
  long local_10;
  uint local_8;
  uint local_4;
  
  local_1c = in_R9D;
  if (in_R9D == 0) {
    local_1c = in_EDI;
  }
  if ((in_ECX == 0xb) || (in_ECX == 0x12)) {
    for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
      local_2c = local_28 * local_1c * in_R8D;
      for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
        *(undefined8 *)(in_RDX + (ulong)local_2c) = 0x2449922449921dff;
        local_2c = in_R8D + local_2c;
      }
    }
  }
  else if (in_ECX == 4) {
    local_18 = in_R8D;
    local_10 = in_RDX;
    local_8 = in_ESI;
    local_4 = in_EDI;
    memset(&uStack_36,0,6);
    for (local_3c = 0; local_3c < local_8; local_3c = local_3c + 1) {
      local_40 = local_3c * local_1c * local_18;
      for (local_44 = 0; local_44 < local_4; local_44 = local_44 + 1) {
        *(ulong *)(local_10 + (ulong)local_40) = CONCAT62(uStack_36,0xffff);
        local_40 = local_18 + local_40;
      }
    }
  }
  return;
}

Assistant:

void basisu_transcoder::write_opaque_alpha_blocks(
		uint32_t num_blocks_x, uint32_t num_blocks_y,
		void* pOutput_blocks, block_format fmt,
		uint32_t block_stride_in_bytes, uint32_t output_row_pitch_in_blocks_or_pixels)
	{
		// 'num_blocks_y', 'pOutput_blocks' & 'block_stride_in_bytes' unused
		// when disabling BASISD_SUPPORT_ETC2_EAC_A8 *and* BASISD_SUPPORT_DXT5A
		BASISU_NOTE_UNUSED(num_blocks_y);
		BASISU_NOTE_UNUSED(pOutput_blocks);
		BASISU_NOTE_UNUSED(block_stride_in_bytes);

		if (!output_row_pitch_in_blocks_or_pixels)
			output_row_pitch_in_blocks_or_pixels = num_blocks_x;
				
		if ((fmt == block_format::cETC2_EAC_A8) || (fmt == block_format::cETC2_EAC_R11))
		{
#if BASISD_SUPPORT_ETC2_EAC_A8
			eac_block blk;
			blk.m_base = 255;
			blk.m_multiplier = 1;
			blk.m_table = 13;

			// Selectors are all 4's
			memcpy(&blk.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));

			for (uint32_t y = 0; y < num_blocks_y; y++)
			{
				uint32_t dst_ofs = y * output_row_pitch_in_blocks_or_pixels * block_stride_in_bytes;
				for (uint32_t x = 0; x < num_blocks_x; x++)
				{
					memcpy((uint8_t*)pOutput_blocks + dst_ofs, &blk, sizeof(blk));
					dst_ofs += block_stride_in_bytes;
				}
			}
#endif
		}
		else if (fmt == block_format::cBC4)
		{
#if BASISD_SUPPORT_DXT5A
			dxt5a_block blk;
			blk.m_endpoints[0] = 255;
			blk.m_endpoints[1] = 255;
			memset(blk.m_selectors, 0, sizeof(blk.m_selectors));

			for (uint32_t y = 0; y < num_blocks_y; y++)
			{
				uint32_t dst_ofs = y * output_row_pitch_in_blocks_or_pixels * block_stride_in_bytes;
				for (uint32_t x = 0; x < num_blocks_x; x++)
				{
					memcpy((uint8_t*)pOutput_blocks + dst_ofs, &blk, sizeof(blk));
					dst_ofs += block_stride_in_bytes;
				}
			}
#endif
		}
	}